

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O3

void __thiscall
QNetworkRequestFactoryPrivate::QNetworkRequestFactoryPrivate(QNetworkRequestFactoryPrivate *this)

{
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QSslConfiguration::QSslConfiguration(&this->sslConfig);
  QUrl::QUrl(&this->baseUrl);
  QHttpHeaders::QHttpHeaders(&this->headers);
  (this->password).d.d = (Data *)0x0;
  (this->password).d.ptr = (char16_t *)0x0;
  (this->userName).d.ptr = (char16_t *)0x0;
  (this->userName).d.size = 0;
  (this->bearerToken).d.size = 0;
  (this->userName).d.d = (Data *)0x0;
  (this->bearerToken).d.d = (Data *)0x0;
  (this->bearerToken).d.ptr = (char *)0x0;
  (this->password).d.size = 0;
  QUrlQuery::QUrlQuery(&this->queryParameters);
  this->priority = NormalPriority;
  (this->transferTimeout).__r = 0;
  (this->attributes).d = (Data *)0x0;
  return;
}

Assistant:

QNetworkRequestFactoryPrivate::QNetworkRequestFactoryPrivate()
    = default;